

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::TaggedUnionExpression::fromSyntax
          (Compilation *compilation,TaggedUnionExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ExpressionSyntax *pEVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Scope *this;
  Symbol *args_1;
  Type *pTVar4;
  Expression *pEVar5;
  Type *pTVar6;
  TaggedUnionExpression *expr;
  Diagnostic *pDVar7;
  string_view name;
  SourceRange SVar8;
  Expression *valueExpr;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  Expression *local_48;
  SourceRange local_40;
  
  if (assignmentTarget != (Type *)0x0) {
    bVar3 = Type::isTaggedUnion(assignmentTarget);
    if (bVar3) {
      name = parsing::Token::valueText(&syntax->member);
      pTVar4 = assignmentTarget->canonical;
      if (pTVar4 == (Type *)0x0) {
        Type::resolveCanonical(assignmentTarget);
        pTVar4 = assignmentTarget->canonical;
      }
      this = Symbol::scopeOrNull(&pTVar4->super_Symbol);
      args_1 = Scope::find(this,name);
      if (args_1 != (Symbol *)0x0) {
        local_48 = (Expression *)0x0;
        pEVar1 = syntax->expr;
        pTVar4 = DeclaredType::getType((DeclaredType *)(args_1 + 1));
        if (pEVar1 == (ExpressionSyntax *)0x0) {
          pTVar6 = pTVar4->canonical;
          if (pTVar6 == (Type *)0x0) {
            Type::resolveCanonical(pTVar4);
            pTVar6 = pTVar4->canonical;
          }
          if ((pTVar6->super_Symbol).kind != VoidType) {
            SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            pDVar7 = ASTContext::addDiag(context,(DiagCode)0x9a0007,SVar8);
            Diagnostic::operator<<(pDVar7,args_1->name);
            goto LAB_00381ed5;
          }
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = context;
          local_48 = Expression::bindRValue
                               ((Expression *)pTVar4,(Type *)syntax->expr,(ExpressionSyntax *)0x0,
                                (SourceRange)(auVar2 << 0x40),(ASTContext *)0x0,
                                in_stack_ffffffffffffffa8);
        }
        local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        expr = BumpAllocator::
               emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,assignmentTarget,args_1,&local_48,
                          &local_40);
        if ((local_48 != (Expression *)0x0) && (bVar3 = Expression::bad(local_48), bVar3)) {
          expr = (TaggedUnionExpression *)Expression::badExpr(compilation,&expr->super_Expression);
        }
        return &expr->super_Expression;
      }
      if (name._M_len != 0) {
        SVar8 = parsing::Token::range(&syntax->member);
        pDVar7 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar8);
        pDVar7 = Diagnostic::operator<<(pDVar7,name);
        ast::operator<<(pDVar7,assignmentTarget);
      }
      goto LAB_00381ed5;
    }
    pTVar4 = assignmentTarget->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
      pTVar4 = assignmentTarget->canonical;
    }
    if ((pTVar4->super_Symbol).kind == ErrorType) goto LAB_00381ed5;
  }
  SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag(context,(DiagCode)0x9b0007,SVar8);
LAB_00381ed5:
  pEVar5 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar5;
}

Assistant:

Expression& TaggedUnionExpression::fromSyntax(Compilation& compilation,
                                              const TaggedUnionExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    if (!assignmentTarget || !assignmentTarget->isTaggedUnion()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::TaggedUnionTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto memberName = syntax.member.valueText();
    auto member = assignmentTarget->getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.member.range());
            diag << memberName << *assignmentTarget;
        }
        return badExpr(compilation, nullptr);
    }

    auto& field = member->as<FieldSymbol>();

    const Expression* valueExpr = nullptr;
    if (syntax.expr) {
        valueExpr = &bindRValue(field.getType(), *syntax.expr, {}, context);
    }
    else if (!field.getType().isVoid()) {
        context.addDiag(diag::TaggedUnionMissingInit, syntax.sourceRange()) << field.name;
        return badExpr(compilation, nullptr);
    }

    auto result = compilation.emplace<TaggedUnionExpression>(*assignmentTarget, *member, valueExpr,
                                                             syntax.sourceRange());
    if (valueExpr && valueExpr->bad())
        return badExpr(compilation, result);

    return *result;
}